

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3Fts5ParserAlloc(_func_void_ptr_u64 *mallocProc)

{
  void *fts5yypRawParser;
  code *in_RDI;
  fts5yyParser *fts5yypParser;
  
  fts5yypRawParser = (void *)(*in_RDI)(0x980);
  if (fts5yypRawParser != (void *)0x0) {
    sqlite3Fts5ParserInit(fts5yypRawParser);
  }
  return fts5yypRawParser;
}

Assistant:

static void *sqlite3Fts5ParserAlloc(void *(*mallocProc)(fts5YYMALLOCARGTYPE) sqlite3Fts5ParserCTX_PDECL){
  fts5yyParser *fts5yypParser;
  fts5yypParser = (fts5yyParser*)(*mallocProc)( (fts5YYMALLOCARGTYPE)sizeof(fts5yyParser) );
  if( fts5yypParser ){
    sqlite3Fts5ParserCTX_STORE
    sqlite3Fts5ParserInit(fts5yypParser sqlite3Fts5ParserCTX_PARAM);
  }
  return (void*)fts5yypParser;
}